

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

Mat3x3d * __thiscall
OpenMD::Stats::getMatrixData(Mat3x3d *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  
  SquareMatrix<double,_3>::SquareMatrix(&__return_storage_ptr__->super_SquareMatrix<double,_3>);
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,
             (RectMatrix<double,_3U,_3U> *)(lVar1 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Stats::getMatrixData(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Mat3x3d value;
    dynamic_cast<MatrixAccumulator*>(data_[index].accumulator)
        ->getLastValue(value);
    return value;
  }